

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base64.cc
# Opt level: O1

int EVP_DecodeUpdate(EVP_ENCODE_CTX *ctx,uchar *out,int *outl,uchar *in,int inl)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  undefined4 in_register_00000084;
  size_t num_bytes_resulting;
  ulong local_50;
  int *local_48;
  int *local_40;
  ulong local_38;
  
  *outl = 0;
  uVar2 = 0xffffffff;
  if (ctx->enc_data[0x2d] == '\0') {
    if (CONCAT44(in_register_00000084,inl) == 0) {
      local_38 = 0;
    }
    else {
      local_48 = &ctx->length;
      lVar3 = 0;
      local_38 = 0;
      local_40 = outl;
      do {
        bVar1 = in[lVar3];
        if ((0x20 < (ulong)bVar1) || (uVar2 = 0, (0x100002600U >> ((ulong)bVar1 & 0x3f) & 1) == 0))
        {
          if (ctx->enc_data[0x2c] == '\0') {
            uVar2 = ctx->num;
            iVar4 = uVar2 + 1;
            ctx->num = iVar4;
            ctx->enc_data[(ulong)uVar2 - 4] = bVar1;
            uVar2 = 0;
            if (iVar4 == 4) {
              uVar2 = base64_decode_quad(out,&local_50,(uint8_t *)local_48);
              if (uVar2 == 0) {
                ctx->enc_data[0x2d] = '\x01';
              }
              else {
                ctx->num = 0;
                local_38 = local_38 + local_50;
                out = out + local_50;
                if (local_50 < 3) {
                  ctx->enc_data[0x2c] = '\x01';
                }
              }
              uVar2 = uVar2 ^ 1;
            }
          }
          else {
            ctx->enc_data[0x2d] = '\x01';
            uVar2 = 1;
          }
        }
        if ((uVar2 & 3) != 0) {
          return -1;
        }
        lVar3 = lVar3 + 1;
        outl = local_40;
      } while (CONCAT44(in_register_00000084,inl) != lVar3);
    }
    uVar2 = 0xffffffff;
    if (local_38 >> 0x1f == 0) {
      *outl = (int)local_38;
      uVar2 = (uint)(ctx->enc_data[0x2c] == '\0');
    }
    else {
      ctx->enc_data[0x2d] = '\x01';
      *outl = 0;
    }
  }
  return uVar2;
}

Assistant:

int EVP_DecodeUpdate(EVP_ENCODE_CTX *ctx, uint8_t *out, int *out_len,
                     const uint8_t *in, size_t in_len) {
  *out_len = 0;

  if (ctx->error_encountered) {
    return -1;
  }

  size_t bytes_out = 0, i;
  for (i = 0; i < in_len; i++) {
    const char c = in[i];
    switch (c) {
      case ' ':
      case '\t':
      case '\r':
      case '\n':
        continue;
    }

    if (ctx->eof_seen) {
      ctx->error_encountered = 1;
      return -1;
    }

    ctx->data[ctx->data_used++] = c;
    if (ctx->data_used == 4) {
      size_t num_bytes_resulting;
      if (!base64_decode_quad(out, &num_bytes_resulting, ctx->data)) {
        ctx->error_encountered = 1;
        return -1;
      }

      ctx->data_used = 0;
      bytes_out += num_bytes_resulting;
      out += num_bytes_resulting;

      if (num_bytes_resulting < 3) {
        ctx->eof_seen = 1;
      }
    }
  }

  if (bytes_out > INT_MAX) {
    ctx->error_encountered = 1;
    *out_len = 0;
    return -1;
  }
  *out_len = (int)bytes_out;

  if (ctx->eof_seen) {
    return 0;
  }

  return 1;
}